

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SequenceConcatExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SequenceConcatExpr,nonstd::span_lite::span<slang::ast::SequenceConcatExpr::Element,18446744073709551615ul>>
          (BumpAllocator *this,
          span<slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL> *args)

{
  SequenceConcatExpr *this_00;
  span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL> local_28;
  span<slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL> *local_18;
  span<slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL> *args_local;
  BumpAllocator *this_local;
  
  local_18 = args;
  args_local = (span<slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL> *)this;
  this_00 = (SequenceConcatExpr *)allocate(this,0x20,8);
  nonstd::span_lite::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>::
  span<slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL,_0>(&local_28,local_18);
  ast::SequenceConcatExpr::SequenceConcatExpr(this_00,local_28);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }